

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

void av1_temporal_filter(AV1_COMP *cpi,int filter_frame_lookahead_idx,int gf_frame_index,
                        FRAME_DIFF *frame_diff,YV12_BUFFER_CONFIG *output_frame)

{
  _Bool _Var1;
  uint uVar2;
  AV1_COMP *cpi_00;
  undefined8 *in_RCX;
  long in_RDI;
  AV1_COMP *unaff_retaddr;
  int is_highbitdepth;
  int compute_frame_diff;
  TemporalFilterData *tf_data;
  TemporalFilterCtx *tf_ctx;
  MultiThreadInfo *mt_info;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 uVar3;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0x42a50);
  uVar2 = (uint)(in_RCX != (undefined8 *)0x0);
  init_tf_ctx((AV1_COMP *)frame_diff,output_frame._4_4_,(int)output_frame,mt_info._4_4_,
              (YV12_BUFFER_CONFIG *)tf_ctx);
  uVar3 = *(undefined4 *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x1b] + 6);
  _Var1 = tf_alloc_and_reset_data
                    ((TemporalFilterData *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0,0x137a056);
  if (!_Var1) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }
  if (*(int *)(in_RDI + 0x9ae48) < 2) {
    tf_do_filtering(unaff_retaddr);
  }
  else {
    av1_tf_do_filtering_mt(cpi_00);
  }
  if (uVar2 != 0) {
    *in_RCX = *(undefined8 *)(in_RDI + 0x3adc0);
    in_RCX[1] = *(undefined8 *)(in_RDI + 0x3adc8);
  }
  tf_dealloc_data((TemporalFilterData *)CONCAT44(uVar2,uVar3),in_stack_ffffffffffffffbc);
  return;
}

Assistant:

void av1_temporal_filter(AV1_COMP *cpi, const int filter_frame_lookahead_idx,
                         int gf_frame_index, FRAME_DIFF *frame_diff,
                         YV12_BUFFER_CONFIG *output_frame) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  // Basic informaton of the current frame.
  TemporalFilterCtx *tf_ctx = &cpi->tf_ctx;
  TemporalFilterData *tf_data = &cpi->td.tf_data;
  const int compute_frame_diff = frame_diff != NULL;
  // TODO(anyone): Currently, we enforce the filtering strength on internal
  // ARFs except the second ARF to be zero. We should investigate in which case
  // it is more beneficial to use non-zero strength filtering.
  // Only parallel level 0 frames go through temporal filtering.
  assert(cpi->ppi->gf_group.frame_parallel_level[gf_frame_index] == 0);

  // Initialize temporal filter context structure.
  init_tf_ctx(cpi, filter_frame_lookahead_idx, gf_frame_index,
              compute_frame_diff, output_frame);

  // Allocate and reset temporal filter buffers.
  const int is_highbitdepth = tf_ctx->is_highbitdepth;
  if (!tf_alloc_and_reset_data(tf_data, tf_ctx->num_pels, is_highbitdepth)) {
    aom_internal_error(cpi->common.error, AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }

  // Perform temporal filtering process.
  if (mt_info->num_workers > 1)
    av1_tf_do_filtering_mt(cpi);
  else
    tf_do_filtering(cpi);

  if (compute_frame_diff) {
    *frame_diff = tf_data->diff;
  }
  // Deallocate temporal filter buffers.
  tf_dealloc_data(tf_data, is_highbitdepth);
}